

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QStyleOptionGraphicsItem>::data(QList<QStyleOptionGraphicsItem> *this)

{
  QArrayDataPointer<QStyleOptionGraphicsItem> *this_00;
  QStyleOptionGraphicsItem *pQVar1;
  QArrayDataPointer<QStyleOptionGraphicsItem> *in_RDI;
  
  detach((QList<QStyleOptionGraphicsItem> *)0xa4290c);
  this_00 = (QArrayDataPointer<QStyleOptionGraphicsItem> *)
            QArrayDataPointer<QStyleOptionGraphicsItem>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QStyleOptionGraphicsItem>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }